

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recall_tree.cc
# Opt level: O3

void recall_tree_ns::save_load_tree(recall_tree *b,io_buf *model_file,bool read,bool text)

{
  v_array<recall_tree_ns::node_pred> *this;
  bool bVar1;
  ostream *poVar2;
  ulong uVar3;
  node *n;
  bool bVar4;
  int iVar5;
  node_pred *data;
  ulong uVar6;
  size_t n_preds;
  size_t n_nodes;
  stringstream msg;
  ulong local_230;
  ulong local_228;
  v_array<recall_tree_ns::node> *local_220;
  ulong local_218;
  node local_210;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  if ((model_file->files)._end != (model_file->files)._begin) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"k",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," = ",3);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    if (read) {
      io_buf::bin_read_fixed(model_file,(char *)&b->k,4,"");
    }
    else {
      bin_text_write_fixed(model_file,(char *)&b->k,4,(stringstream *)local_1b8,text);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"node_only",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," = ",3);
    bVar4 = SUB81((ostream *)local_1a8,0);
    poVar2 = std::ostream::_M_insert<bool>(bVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    if (read) {
      io_buf::bin_read_fixed(model_file,&b->node_only,1,"");
    }
    else {
      bin_text_write_fixed(model_file,&b->node_only,1,(stringstream *)local_1b8,text);
    }
    local_228 = ((long)(b->nodes)._end - (long)(b->nodes)._begin >> 3) * 0x2e8ba2e8ba2e8ba3;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"nodes",5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," = ",3);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    local_220 = &b->nodes;
    if (read) {
      io_buf::bin_read_fixed(model_file,(char *)&local_228,8,"");
      v_array<recall_tree_ns::node>::clear(local_220);
      if (local_228 != 0) {
        uVar3 = 1;
        do {
          local_210._8_4_ = local_210._8_4_ & 0xffffff00;
          local_210.parent = 0;
          local_210.recall_lbest = 0.0;
          local_210.depth = 0;
          local_210.base_router = 0;
          local_210.left = 0;
          local_210.right = 0;
          local_210.n = 0.0;
          local_210.entropy = 0.0;
          local_210.passes = 1.0;
          local_210.preds.end_array = (node_pred *)0x0;
          local_210.preds.erase_count = 0;
          local_210.preds._begin = (node_pred *)0x0;
          local_210.preds._end = (node_pred *)0x0;
          v_array<recall_tree_ns::node>::push_back(local_220,&local_210);
          bVar1 = uVar3 < local_228;
          uVar3 = (ulong)((int)uVar3 + 1);
        } while (bVar1);
      }
    }
    else {
      bin_text_write_fixed(model_file,(char *)&local_228,8,(stringstream *)local_1b8,text);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"max_candidates",0xe);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," = ",3);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    if (read) {
      io_buf::bin_read_fixed(model_file,(char *)&b->max_candidates,8,"");
    }
    else {
      bin_text_write_fixed(model_file,(char *)&b->max_candidates,8,(stringstream *)local_1b8,text);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"max_depth",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," = ",3);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    if (read) {
      io_buf::bin_read_fixed(model_file,(char *)&b->max_depth,8,"");
    }
    else {
      bin_text_write_fixed(model_file,(char *)&b->max_depth,8,(stringstream *)local_1b8,text);
    }
    if (local_228 != 0) {
      uVar3 = 0;
      do {
        n = local_220->_begin + uVar3;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"parent",6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," = ",3);
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
        if (read) {
          io_buf::bin_read_fixed(model_file,(char *)n,4,"");
        }
        else {
          bin_text_write_fixed(model_file,(char *)n,4,(stringstream *)local_1b8,text);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"recall_lbest",0xc);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," = ",3);
        poVar2 = std::ostream::_M_insert<double>((double)n->recall_lbest);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
        if (read) {
          io_buf::bin_read_fixed(model_file,(char *)&n->recall_lbest,4,"");
        }
        else {
          bin_text_write_fixed(model_file,(char *)&n->recall_lbest,4,(stringstream *)local_1b8,text)
          ;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"internal",8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," = ",3);
        poVar2 = std::ostream::_M_insert<bool>(bVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
        if (read) {
          io_buf::bin_read_fixed(model_file,&n->internal,1,"");
        }
        else {
          bin_text_write_fixed(model_file,&n->internal,1,(stringstream *)local_1b8,text);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"depth",5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," = ",3);
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
        if (read) {
          io_buf::bin_read_fixed(model_file,(char *)&n->depth,4,"");
        }
        else {
          bin_text_write_fixed(model_file,(char *)&n->depth,4,(stringstream *)local_1b8,text);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"base_router",0xb);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," = ",3);
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
        if (read) {
          io_buf::bin_read_fixed(model_file,(char *)&n->base_router,4,"");
        }
        else {
          bin_text_write_fixed(model_file,(char *)&n->base_router,4,(stringstream *)local_1b8,text);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"left",4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," = ",3);
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
        if (read) {
          io_buf::bin_read_fixed(model_file,(char *)&n->left,4,"");
        }
        else {
          bin_text_write_fixed(model_file,(char *)&n->left,4,(stringstream *)local_1b8,text);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"right",5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," = ",3);
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
        if (read) {
          io_buf::bin_read_fixed(model_file,(char *)&n->right,4,"");
        }
        else {
          bin_text_write_fixed(model_file,(char *)&n->right,4,(stringstream *)local_1b8,text);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"n",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," = ",3);
        poVar2 = std::ostream::_M_insert<double>(n->n);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
        if (read) {
          io_buf::bin_read_fixed(model_file,(char *)&n->n,8,"");
        }
        else {
          bin_text_write_fixed(model_file,(char *)&n->n,8,(stringstream *)local_1b8,text);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"entropy",7);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," = ",3);
        poVar2 = std::ostream::_M_insert<double>(n->entropy);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
        if (read) {
          io_buf::bin_read_fixed(model_file,(char *)&n->entropy,8,"");
        }
        else {
          bin_text_write_fixed(model_file,(char *)&n->entropy,8,(stringstream *)local_1b8,text);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"passes",6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," = ",3);
        poVar2 = std::ostream::_M_insert<double>(n->passes);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
        if (read) {
          io_buf::bin_read_fixed(model_file,(char *)&n->passes,8,"");
        }
        else {
          bin_text_write_fixed(model_file,(char *)&n->passes,8,(stringstream *)local_1b8,text);
        }
        local_230 = (long)(n->preds)._end - (long)(n->preds)._begin >> 4;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"n_preds",7);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," = ",3);
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
        this = &n->preds;
        if (read) {
          io_buf::bin_read_fixed(model_file,(char *)&local_230,8,"");
          v_array<recall_tree_ns::node_pred>::clear(this);
          if (local_230 != 0) {
            uVar6 = 1;
            do {
              local_210._0_8_ = local_210._0_8_ & 0xffffffff00000000;
              local_210._8_4_ = 0;
              local_210.depth = 0;
              v_array<recall_tree_ns::node_pred>::push_back(this,(node_pred *)&local_210);
              bVar1 = uVar6 < local_230;
              uVar6 = (ulong)((int)uVar6 + 1);
            } while (bVar1);
            goto LAB_001d8b2d;
          }
LAB_001d8c78:
          iVar5 = (int)uVar3;
          compute_recall_lbest(b,n);
        }
        else {
          bin_text_write_fixed(model_file,(char *)&local_230,8,(stringstream *)local_1b8,text);
LAB_001d8b2d:
          local_218 = uVar3;
          if (local_230 != 0) {
            uVar3 = 0;
            uVar6 = 1;
            do {
              data = this->_begin + uVar3;
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"label",5);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," = ",3);
              poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
              if (read) {
                io_buf::bin_read_fixed(model_file,(char *)data,4,"");
              }
              else {
                bin_text_write_fixed(model_file,(char *)data,4,(stringstream *)local_1b8,text);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"label_count",0xb);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," = ",3);
              poVar2 = std::ostream::_M_insert<double>(data->label_count);
              std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
              if (read) {
                io_buf::bin_read_fixed(model_file,(char *)&data->label_count,8,"");
              }
              else {
                bin_text_write_fixed
                          (model_file,(char *)&data->label_count,8,(stringstream *)local_1b8,text);
              }
              bVar1 = uVar6 < local_230;
              uVar3 = uVar6;
              uVar6 = (ulong)((int)uVar6 + 1);
            } while (bVar1);
          }
          iVar5 = (int)local_218;
          uVar3 = local_218;
          if (read) goto LAB_001d8c78;
        }
        uVar3 = (ulong)(iVar5 + 1);
      } while (uVar3 < local_228);
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  }
  return;
}

Assistant:

void save_load_tree(recall_tree& b, io_buf& model_file, bool read, bool text)
{
  if (model_file.files.size() > 0)
  {
    stringstream msg;

    writeit(b.k, "k");
    writeit(b.node_only, "node_only");
    writeitvar(b.nodes.size(), "nodes", n_nodes);

    if (read)
    {
      b.nodes.clear();
      for (uint32_t j = 0; j < n_nodes; ++j)
      {
        b.nodes.push_back(node());
      }
    }

    writeit(b.max_candidates, "max_candidates");
    writeit(b.max_depth, "max_depth");

    for (uint32_t j = 0; j < n_nodes; ++j)
    {
      node* cn = &b.nodes[j];

      writeit(cn->parent, "parent");
      writeit(cn->recall_lbest, "recall_lbest");
      writeit(cn->internal, "internal");
      writeit(cn->depth, "depth");
      writeit(cn->base_router, "base_router");
      writeit(cn->left, "left");
      writeit(cn->right, "right");
      writeit(cn->n, "n");
      writeit(cn->entropy, "entropy");
      writeit(cn->passes, "passes");

      writeitvar(cn->preds.size(), "n_preds", n_preds);

      if (read)
      {
        cn->preds.clear();

        for (uint32_t k = 0; k < n_preds; ++k)
        {
          cn->preds.push_back(node_pred(0));
        }
      }

      for (uint32_t k = 0; k < n_preds; ++k)
      {
        node_pred* pred = &cn->preds[k];

        writeit(pred->label, "label");
        writeit(pred->label_count, "label_count");
      }

      if (read)
      {
        compute_recall_lbest(b, cn);
      }
    }
  }
}